

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testMinMaxEigenValue<Imath_3_2::Matrix44<float>>(Matrix44<float> *A)

{
  Matrix44<float> *in_RDI;
  Matrix44<float> *pMVar1;
  float fVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  int i;
  int dim;
  Matrix44<float> A3;
  Matrix44<float> A2;
  Matrix44<float> A1;
  T threshold;
  Matrix44<float> V;
  Matrix44<float> U;
  TV S;
  TV maxV;
  TV minV;
  int local_184;
  undefined4 in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  Matrix44<float> local_13c;
  Matrix44<float> local_fc;
  BaseType_conflict2 local_bc;
  Matrix44<float> local_b8;
  Matrix44<float> local_78;
  Vec4<float> local_38;
  Vec4<float> local_28;
  Vec4<float> local_18;
  Matrix44<float> *local_8;
  
  local_8 = in_RDI;
  Imath_3_2::Vec4<float>::Vec4(&local_18);
  Imath_3_2::Vec4<float>::Vec4(&local_28);
  Imath_3_2::Vec4<float>::Vec4(&local_38);
  Imath_3_2::Matrix44<float>::Matrix44(&local_78);
  Imath_3_2::Matrix44<float>::Matrix44(&local_b8);
  local_bc = computeThreshold<Imath_3_2::Matrix44<float>>
                       ((Matrix44<float> *)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  Imath_3_2::Matrix44<float>::Matrix44(&local_fc,local_8);
  Imath_3_2::minEigenVector<Imath_3_2::Matrix44<float>,Imath_3_2::Vec4<float>>
            ((Matrix44 *)&local_fc,(Vec4 *)&local_18);
  Imath_3_2::Matrix44<float>::Matrix44(&local_13c,local_8);
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix44<float>,Imath_3_2::Vec4<float>>
            ((Matrix44 *)&local_13c,(Vec4 *)&local_28);
  Imath_3_2::Matrix44<float>::Matrix44((Matrix44<float> *)&stack0xfffffffffffffe84,local_8);
  fVar2 = std::numeric_limits<float>::epsilon();
  Imath_3_2::jacobiSVD<float>
            ((Matrix44 *)&stack0xfffffffffffffe84,(Matrix44 *)&local_78,(Vec4 *)&local_38,
             (Matrix44 *)&local_b8,fVar2,false);
  local_184 = 0;
  while( true ) {
    if (3 < local_184) {
      return;
    }
    Imath_3_2::Vec4<float>::operator[](&local_18,local_184);
    pMVar1 = &local_b8;
    Imath_3_2::Matrix44<float>::operator[](pMVar1,local_184);
    std::abs((int)pMVar1);
    if (local_bc <= extraout_XMM0_Da) break;
    Imath_3_2::Vec4<float>::operator[](&local_28,local_184);
    pMVar1 = &local_b8;
    Imath_3_2::Matrix44<float>::operator[](pMVar1,local_184);
    std::abs((int)pMVar1);
    if (local_bc <= extraout_XMM0_Da_00) {
      __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<float>]")
      ;
    }
    local_184 = local_184 + 1;
  }
  __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<float>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}